

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

void roaring_bitmap_statistics(roaring_bitmap_t *r,roaring_statistics_t *stat)

{
  container_t *c;
  int iVar1;
  uint64_t uVar2;
  int iVar3;
  int *piVar4;
  uint8_t uVar5;
  uint8_t uVar6;
  int i;
  long lVar7;
  min_max_sum_t mms;
  undefined8 local_30;
  uint64_t local_28;
  
  stat->sum_value = 0;
  stat->cardinality = 0;
  stat->n_bytes_run_containers = 0;
  stat->n_bytes_bitset_containers = 0;
  stat->max_value = 0;
  stat->min_value = 0;
  stat->n_values_array_containers = 0;
  stat->n_values_run_containers = 0;
  stat->n_values_bitset_containers = 0;
  stat->n_bytes_array_containers = 0;
  stat->n_containers = 0;
  stat->n_array_containers = 0;
  stat->n_run_containers = 0;
  stat->n_bitset_containers = 0;
  stat->n_containers = (r->high_low_container).size;
  uVar2 = roaring_bitmap_get_cardinality(r);
  stat->cardinality = uVar2;
  local_30 = 0xffffffff;
  local_28 = 0;
  roaring_iterate(r,min_max_sum_fnc,&local_30);
  stat->max_value = (int)((ulong)local_30 >> 0x20);
  stat->min_value = (int)local_30;
  stat->sum_value = local_28;
  for (lVar7 = 0; lVar7 < (r->high_low_container).size; lVar7 = lVar7 + 1) {
    c = (r->high_low_container).containers[lVar7];
    uVar5 = (r->high_low_container).typecodes[lVar7];
    uVar6 = uVar5;
    if (uVar5 == '\x04') {
      uVar6 = *(uint8_t *)((long)c + 8);
    }
    iVar1 = container_get_cardinality(c,uVar5);
    piVar4 = (int *)(r->high_low_container).containers[lVar7];
    uVar5 = (r->high_low_container).typecodes[lVar7];
    if (uVar5 == '\x04') {
      uVar5 = (uint8_t)piVar4[2];
      piVar4 = *(int **)piVar4;
    }
    if (uVar5 == '\x01') {
      iVar3 = 0x2000;
    }
    else if (uVar5 == '\x03') {
      iVar3 = *piVar4 * 4 + 2;
    }
    else {
      iVar3 = *piVar4 * 2;
    }
    if (uVar6 == '\x03') {
      stat->n_run_containers = stat->n_run_containers + 1;
      stat->n_values_run_containers = stat->n_values_run_containers + iVar1;
      stat->n_bytes_run_containers = stat->n_bytes_run_containers + iVar3;
    }
    else if (uVar6 == '\x02') {
      stat->n_array_containers = stat->n_array_containers + 1;
      stat->n_values_array_containers = stat->n_values_array_containers + iVar1;
      stat->n_bytes_array_containers = stat->n_bytes_array_containers + iVar3;
    }
    else {
      stat->n_bitset_containers = stat->n_bitset_containers + 1;
      stat->n_values_bitset_containers = stat->n_values_bitset_containers + iVar1;
      stat->n_bytes_bitset_containers = stat->n_bytes_bitset_containers + iVar3;
    }
  }
  return;
}

Assistant:

void roaring_bitmap_statistics(const roaring_bitmap_t *r,
                               roaring_statistics_t *stat) {
    const roaring_array_t *ra = &r->high_low_container;

    memset(stat, 0, sizeof(*stat));
    stat->n_containers = ra->size;
    stat->cardinality = roaring_bitmap_get_cardinality(r);
    min_max_sum_t mms;
    mms.min = UINT32_C(0xFFFFFFFF);
    mms.max = UINT32_C(0);
    mms.sum = 0;
    roaring_iterate(r, &min_max_sum_fnc, &mms);
    stat->min_value = mms.min;
    stat->max_value = mms.max;
    stat->sum_value = mms.sum;

    for (int i = 0; i < ra->size; ++i) {
        uint8_t truetype =
            get_container_type(ra->containers[i], ra->typecodes[i]);
        uint32_t card =
            container_get_cardinality(ra->containers[i], ra->typecodes[i]);
        uint32_t sbytes =
            container_size_in_bytes(ra->containers[i], ra->typecodes[i]);
        switch (truetype) {
            case BITSET_CONTAINER_TYPE:
                stat->n_bitset_containers++;
                stat->n_values_bitset_containers += card;
                stat->n_bytes_bitset_containers += sbytes;
                break;
            case ARRAY_CONTAINER_TYPE:
                stat->n_array_containers++;
                stat->n_values_array_containers += card;
                stat->n_bytes_array_containers += sbytes;
                break;
            case RUN_CONTAINER_TYPE:
                stat->n_run_containers++;
                stat->n_values_run_containers += card;
                stat->n_bytes_run_containers += sbytes;
                break;
            default:
                assert(false);
                roaring_unreachable;
        }
    }
}